

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigStrSim.c
# Opt level: O2

void Saig_StrSimSetFinalMatching(Aig_Man_t *p0,Aig_Man_t *p1)

{
  Aig_Obj_t **ppAVar1;
  int iVar2;
  Aig_Obj_t *pAVar3;
  Aig_Obj_t *pAVar4;
  Aig_Obj_t *pAVar5;
  uint uVar6;
  Vec_Ptr_t *p;
  int iVar7;
  uint uVar8;
  
  Aig_ManIncrementTravId(p0);
  iVar7 = 0;
  uVar6 = 0;
  uVar8 = 0;
  do {
    p = p0->vObjs;
    iVar2 = p->nSize;
    if (iVar2 <= iVar7) {
      iVar7 = 0;
      do {
        if (iVar2 <= iVar7) {
          Abc_Print((int)p,"Total matches = %6d.  Wrong matches = %6d.  Ratio = %5.2f %%\n",
                    ((double)(int)uVar8 * 100.0) / (double)(int)uVar6,(ulong)uVar6,(ulong)uVar8);
          return;
        }
        pAVar3 = (Aig_Obj_t *)Vec_PtrEntry(p,iVar7);
        if (((pAVar3 != (Aig_Obj_t *)0x0) && (p0->pReprs != (Aig_Obj_t **)0x0)) &&
           (pAVar5 = p0->pReprs[pAVar3->Id], pAVar5 != (Aig_Obj_t *)0x0)) {
          if ((p1->pReprs == (Aig_Obj_t **)0x0) || (pAVar3 != p1->pReprs[pAVar5->Id])) {
            __assert_fail("pObj0 == Aig_ObjRepr( p1, pObj1 )",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/saig/saigStrSim.c"
                          ,0x269,"void Saig_StrSimSetFinalMatching(Aig_Man_t *, Aig_Man_t *)");
          }
          if (pAVar3->TravId == p0->nTravIds) {
            Aig_ObjSetRepr(p0,pAVar3,(Aig_Obj_t *)0x0);
            Aig_ObjSetRepr(p1,pAVar5,(Aig_Obj_t *)0x0);
          }
        }
        iVar7 = iVar7 + 1;
        p = p0->vObjs;
        iVar2 = p->nSize;
      } while( true );
    }
    pAVar3 = (Aig_Obj_t *)Vec_PtrEntry(p,iVar7);
    if (((pAVar3 != (Aig_Obj_t *)0x0) && (ppAVar1 = p0->pReprs, ppAVar1 != (Aig_Obj_t **)0x0)) &&
       (pAVar5 = ppAVar1[pAVar3->Id], pAVar5 != (Aig_Obj_t *)0x0)) {
      if ((p1->pReprs == (Aig_Obj_t **)0x0) || (pAVar3 != p1->pReprs[pAVar5->Id])) {
        __assert_fail("pObj0 == Aig_ObjRepr( p1, pObj1 )",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/saig/saigStrSim.c"
                      ,0x248,"void Saig_StrSimSetFinalMatching(Aig_Man_t *, Aig_Man_t *)");
      }
      uVar6 = uVar6 + 1;
      if ((*(uint *)&pAVar3->field_0x18 & 7) - 7 < 0xfffffffe) {
        iVar2 = Saig_ObjIsLo(p0,pAVar3);
        if (iVar2 != 0) {
          iVar2 = Saig_ObjIsLo(p1,pAVar5);
          if (iVar2 == 0) {
            __assert_fail("Saig_ObjIsLo(p1, pObj1)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/saig/saigStrSim.c"
                          ,0x259,"void Saig_StrSimSetFinalMatching(Aig_Man_t *, Aig_Man_t *)");
          }
          pAVar4 = Saig_ObjLoToLi(p0,pAVar3);
          pAVar4 = pAVar4->pFanin0;
          pAVar5 = Saig_ObjLoToLi(p1,pAVar5);
          if (p0->pReprs == (Aig_Obj_t **)0x0) {
            pAVar4 = (Aig_Obj_t *)0x0;
          }
          else {
            pAVar4 = p0->pReprs[*(int *)(((ulong)pAVar4 & 0xfffffffffffffffe) + 0x24)];
          }
          if (pAVar4 != (Aig_Obj_t *)((ulong)pAVar5->pFanin0 & 0xfffffffffffffffe))
          goto LAB_0059c3d9;
        }
      }
      else {
        if ((*(uint *)&pAVar5->field_0x18 & 7) - 7 < 0xfffffffe) {
          __assert_fail("Aig_ObjIsNode(pObj1)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/saig/saigStrSim.c"
                        ,0x24b,"void Saig_StrSimSetFinalMatching(Aig_Man_t *, Aig_Man_t *)");
        }
        if ((ppAVar1[*(int *)(((ulong)pAVar3->pFanin0 & 0xfffffffffffffffe) + 0x24)] !=
             (Aig_Obj_t *)((ulong)pAVar5->pFanin0 & 0xfffffffffffffffe)) ||
           (ppAVar1[*(int *)(((ulong)pAVar3->pFanin1 & 0xfffffffffffffffe) + 0x24)] !=
            (Aig_Obj_t *)((ulong)pAVar5->pFanin1 & 0xfffffffffffffffe))) {
LAB_0059c3d9:
          pAVar3->TravId = p0->nTravIds;
          uVar8 = uVar8 + 1;
        }
      }
    }
    iVar7 = iVar7 + 1;
  } while( true );
}

Assistant:

void Saig_StrSimSetFinalMatching( Aig_Man_t * p0, Aig_Man_t * p1 )
{
    Aig_Obj_t * pObj0, * pObj1;
    Aig_Obj_t * pFanin00, * pFanin01;
    Aig_Obj_t * pFanin10, * pFanin11;
    int i, CountAll = 0, CountNot = 0;
    Aig_ManIncrementTravId( p0 );
    Aig_ManForEachObj( p0, pObj0, i )
    {
        pObj1 = Aig_ObjRepr( p0, pObj0 );
        if ( pObj1 == NULL )
            continue;
        CountAll++;
        assert( pObj0 == Aig_ObjRepr( p1, pObj1 ) );
        if ( Aig_ObjIsNode(pObj0) )
        {
            assert( Aig_ObjIsNode(pObj1) );
            pFanin00 = Aig_ObjFanin0(pObj0);
            pFanin01 = Aig_ObjFanin1(pObj0);
            pFanin10 = Aig_ObjFanin0(pObj1);
            pFanin11 = Aig_ObjFanin1(pObj1);
            if ( Aig_ObjRepr(p0, pFanin00) != pFanin10 ||
                 Aig_ObjRepr(p0, pFanin01) != pFanin11 )
            {
                Aig_ObjSetTravIdCurrent(p0, pObj0);
                CountNot++;
            }
        }
        else if ( Saig_ObjIsLo(p0, pObj0) )
        {
            assert( Saig_ObjIsLo(p1, pObj1) );
            pFanin00 = Aig_ObjFanin0( Saig_ObjLoToLi(p0, pObj0) );
            pFanin10 = Aig_ObjFanin0( Saig_ObjLoToLi(p1, pObj1) );
            if ( Aig_ObjRepr(p0, pFanin00) != pFanin10 )
            {
                Aig_ObjSetTravIdCurrent(p0, pObj0);
                CountNot++;
            }
        }
    }
    // remove irrelevant matches
    Aig_ManForEachObj( p0, pObj0, i )
    {
        pObj1 = Aig_ObjRepr( p0, pObj0 );
        if ( pObj1 == NULL )
            continue;
        assert( pObj0 == Aig_ObjRepr( p1, pObj1 ) );
        if ( Aig_ObjIsTravIdCurrent( p0, pObj0 ) )
        {
            Aig_ObjSetRepr( p0, pObj0, NULL );
            Aig_ObjSetRepr( p1, pObj1, NULL );
        }
    }
    Abc_Print( 1, "Total matches = %6d.  Wrong matches = %6d.  Ratio = %5.2f %%\n",
        CountAll, CountNot, 100.0*CountNot/CountAll );
}